

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_fs_open(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  char *local_4e0;
  int64_t eval_b_3;
  int64_t eval_a_3;
  char *local_4c0;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char cStack_480;
  char cStack_47f;
  char cStack_47e;
  char cStack_47d;
  char cStack_47c;
  char cStack_47b;
  char dev_null [10];
  uv_stdio_container_t stdio [1];
  uv_buf_t buf;
  uv_write_t write_req2;
  uv_write_t write_req;
  uv_pipe_t in;
  uv_fs_t fs_req;
  int local_18;
  uv_os_fd_t dup_fd;
  uv_os_fd_t fd;
  int r;
  
  eval_a._6_1_ = '/';
  eval_a._7_1_ = 'd';
  cStack_480 = 'e';
  cStack_47f = 'v';
  cStack_47e = '/';
  cStack_47d = 'n';
  cStack_47c = 'u';
  cStack_47b = 'l';
  dev_null[0] = 'l';
  dev_null[1] = '\0';
  dup_fd = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&in.pipe_fname,(char *)((long)&eval_a + 6),2,0,
                      (uv_fs_cb)0x0);
  if ((long)dup_fd != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x702,"r","==","0",(long)dup_fd,"==",0);
    abort();
  }
  local_18 = (int)fs_req.cb;
  init_process_options("spawn_helper8",exit_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)&write_req.bufsml[3].len,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x707,"uv_pipe_init(uv_default_loop(), &in, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  options.stdio = (uv_stdio_container_t *)(dev_null + 2);
  dev_null[2] = '\x11';
  dev_null[3] = '\0';
  dev_null[4] = '\0';
  dev_null[5] = '\0';
  stdio[0]._0_8_ = &write_req.bufsml[3].len;
  options.stdio_count = 1;
  fs_req.bufsml[3].len._4_4_ = dup(local_18);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x71c,"uv_spawn(uv_default_loop(), &process, &options)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_buf_init((char *)&local_18,4);
  eval_a_3 = (int64_t)uVar3.base;
  stdio[0].data = (anon_union_8_2_13e1ed65_for_data)eval_a_3;
  local_4c0 = (char *)uVar3.len;
  buf.base = local_4c0;
  iVar1 = uv_write((uv_write_t *)&write_req2.bufsml[3].len,(uv_stream_t *)&write_req.bufsml[3].len,
                   (uv_buf_t *)&stdio[0].data,1,write_null_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x723,"uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_null_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_buf_init((char *)((long)&fs_req.bufsml[3].len + 4),4);
  eval_a_4 = (int64_t)uVar3.base;
  stdio[0].data = (anon_union_8_2_13e1ed65_for_data)eval_a_4;
  local_4e0 = (char *)uVar3.len;
  buf.base = local_4e0;
  iVar1 = uv_write((uv_write_t *)&buf.len,(uv_stream_t *)&write_req.bufsml[3].len,
                   (uv_buf_t *)&stdio[0].data,1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x726,"uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x728,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&in.pipe_fname,local_18,(uv_fs_cb)0x0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x729,"uv_fs_close(((void*)0), &fs_req, fd, ((void*)0))","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x72b,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x72c,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x72e,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_fs_open) {
  int r;
  uv_os_fd_t fd;
  uv_os_fd_t dup_fd;
  uv_fs_t fs_req;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_write_t write_req2;
  uv_buf_t buf;
  uv_stdio_container_t stdio[1];
#ifdef _WIN32
  const char dev_null[] = "NUL";
  HMODULE kernelbase_module;
  sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#else
  const char dev_null[] = "/dev/null";
#endif

  r = uv_fs_open(NULL, &fs_req, dev_null, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  fd = (uv_os_fd_t) fs_req.result;

  init_process_options("spawn_helper8", exit_cb);

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &in, 0));

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  /* make an inheritable copy */
#ifdef _WIN32
  ASSERT_NE(0, DuplicateHandle(GetCurrentProcess(), fd, GetCurrentProcess(), &dup_fd,
                               0, /* inherit */ TRUE, DUPLICATE_SAME_ACCESS));
  kernelbase_module = GetModuleHandleA("kernelbase.dll");
  pCompareObjectHandles = (sCompareObjectHandles)
      GetProcAddress(kernelbase_module, "CompareObjectHandles");
  ASSERT_NE(pCompareObjectHandles == NULL ||
            pCompareObjectHandles(fd, dup_fd),
            0);
#else
  dup_fd = dup(fd);
#endif

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init((char*) &fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req,
                     (uv_stream_t*) &in,
                     &buf,
                     1,
                     write_null_cb));

  buf = uv_buf_init((char*) &dup_fd, sizeof(fd));
  ASSERT_OK(uv_write(&write_req2, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_OK(uv_fs_close(NULL, &fs_req, fd, NULL));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called);  /* One for `in`, one for process */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}